

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool QFontDatabase::removeApplicationEmojiFontFamily(QString *familyName)

{
  bool bVar1;
  Type *mutex;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)familyName);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_28,mutex);
  QFontDatabasePrivate::instance();
  bVar1 = QFontDatabasePrivate::removeApplicationFallbackFontFamily
                    (&QFontDatabasePrivate::instance::instance,Script_Emoji,familyName);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDatabase::removeApplicationEmojiFontFamily(const QString &familyName)
{
    QMutexLocker locker(fontDatabaseMutex());
    auto *db = QFontDatabasePrivate::instance();
    return db->removeApplicationFallbackFontFamily(QFontDatabasePrivate::Script_Emoji,
                                                   familyName);
}